

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.h
# Opt level: O2

SegmentIdentificationHeader *
lrit::getHeader<lrit::SegmentIdentificationHeader>
          (SegmentIdentificationHeader *__return_storage_ptr__,Buffer *b,HeaderMap *m)

{
  const_iterator cVar1;
  runtime_error *this;
  int *in_R9;
  char local_44 [4];
  string local_40;
  
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find(&m->_M_t,&SegmentIdentificationHeader::CODE);
  if ((_Rb_tree_header *)cVar1._M_node != &(m->_M_t)._M_impl.super__Rb_tree_header) {
    getHeader<lrit::SegmentIdentificationHeader>
              (__return_storage_ptr__,b,*(int *)&cVar1._M_node[1].field_0x4);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_44[0] = -0x5b;
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  util::str<char[37],char[86],char[2],int>
            (&local_40,(util *)"Assertion `it != m.end()` failed at ",
             (char (*) [37])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lrit/lrit.h"
             ,(char (*) [86])0x14014f,(char (*) [2])local_44,in_R9);
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

H getHeader(const Buffer& b, const HeaderMap& m) {
  auto it = m.find(H::CODE);
  ASSERT(it != m.end());
  return getHeader<H>(b, it->second);
}